

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  container_t *candidate_shared_container;
  _Bool _Var3;
  uint uVar4;
  undefined8 in_RAX;
  array_container_t *container1;
  array_container_t *container1_00;
  ulong uVar5;
  size_t n;
  uint64_t *s2;
  array_container_t *paVar6;
  uint64_t *s1;
  int i;
  long lVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  uVar4 = (r1->high_low_container).size;
  uVar8 = 0;
  if (uVar4 == (r2->high_low_container).size) {
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
    }
    do {
      if (uVar5 == uVar8) {
        lVar7 = 0;
        uStack_38 = in_RAX;
        goto LAB_00114323;
      }
      puVar1 = (r1->high_low_container).keys + uVar8;
      puVar2 = (r2->high_low_container).keys + uVar8;
      uVar8 = uVar8 + 1;
    } while (*puVar1 == *puVar2);
LAB_0011430b:
    uVar8 = 0;
  }
LAB_0011430e:
  return SUB81(uVar8,0);
LAB_00114323:
  uVar8 = (ulong)((int)uVar4 <= lVar7);
  if ((int)uVar4 <= lVar7) goto LAB_0011430e;
  candidate_shared_container = (r2->high_low_container).containers[lVar7];
  uStack_38 = CONCAT17((r1->high_low_container).typecodes[lVar7],
                       CONCAT16((r2->high_low_container).typecodes[lVar7],(undefined6)uStack_38));
  container1 = (array_container_t *)
               container_unwrap_shared
                         ((r1->high_low_container).containers[lVar7],
                          (uint8_t *)((long)&uStack_38 + 7));
  container1_00 =
       (array_container_t *)
       container_unwrap_shared(candidate_shared_container,(uint8_t *)((long)&uStack_38 + 6));
  switch((uint)uStack_38._6_1_ + (uint)uStack_38._7_1_ * 4) {
  case 5:
    _Var3 = bitset_container_equals
                      ((bitset_container_t *)container1,(bitset_container_t *)container1_00);
    goto LAB_0011441b;
  case 6:
    paVar6 = container1;
    break;
  case 7:
    paVar6 = container1;
    goto LAB_00114416;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x12a0,
                  "_Bool container_equals(const container_t *, uint8_t, const container_t *, uint8_t)"
                 );
  case 9:
    paVar6 = container1_00;
    container1_00 = container1;
    break;
  case 10:
    if (container1->cardinality == container1_00->cardinality) {
      s1 = (uint64_t *)container1->array;
      s2 = (uint64_t *)container1_00->array;
      n = (long)container1->cardinality * 2;
      goto LAB_001143d7;
    }
    goto LAB_0011430b;
  case 0xb:
    paVar6 = container1;
    goto LAB_001143f4;
  case 0xd:
    paVar6 = container1_00;
    container1_00 = container1;
LAB_00114416:
    _Var3 = run_container_equals_bitset
                      ((run_container_t *)container1_00,(bitset_container_t *)paVar6);
    goto LAB_0011441b;
  case 0xe:
    paVar6 = container1_00;
    container1_00 = container1;
LAB_001143f4:
    _Var3 = run_container_equals_array((run_container_t *)container1_00,paVar6);
    goto LAB_0011441b;
  case 0xf:
    if (container1->cardinality == container1_00->cardinality) {
      s1 = (uint64_t *)container1->array;
      s2 = (uint64_t *)container1_00->array;
      n = (long)container1->cardinality << 2;
LAB_001143d7:
      _Var3 = memequals(s1,s2,n);
      goto LAB_0011441b;
    }
    goto LAB_0011430b;
  }
  _Var3 = array_container_equal_bitset(container1_00,(bitset_container_t *)paVar6);
LAB_0011441b:
  if (_Var3 == false) goto LAB_0011430e;
  lVar7 = lVar7 + 1;
  uVar4 = (r1->high_low_container).size;
  goto LAB_00114323;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i],
                                         ra1->typecodes[i],
                                         ra2->containers[i],
                                         ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}